

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union.c
# Opt level: O0

void lyb_parse_union(void *lyb_data,size_t lyb_data_len,uint32_t *type_idx,void **lyb_value,
                    size_t *lyb_value_len)

{
  uint64_t num;
  size_t *lyb_value_len_local;
  void **lyb_value_local;
  uint32_t *type_idx_local;
  size_t lyb_data_len_local;
  void *lyb_data_local;
  
  if ((lyb_data != (void *)0x0) && ((lyb_value == (void **)0x0 || (lyb_value_len != (size_t *)0x0)))
     ) {
    if (type_idx != (uint32_t *)0x0) {
      *type_idx = *lyb_data;
    }
    if (((lyb_value != (void **)0x0) && (lyb_value_len != (size_t *)0x0)) && (lyb_data_len != 0)) {
      if (lyb_data_len == 4) {
        *lyb_value_len = 0;
        *lyb_value = "";
      }
      else {
        *lyb_value_len = lyb_data_len - 4;
        *lyb_value = (void *)((long)lyb_data + 4);
      }
    }
    return;
  }
  __assert_fail("lyb_data && !(lyb_value && !lyb_value_len)",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_types/union.c"
                ,0x84,
                "void lyb_parse_union(const void *, size_t, uint32_t *, const void **, size_t *)");
}

Assistant:

static void
lyb_parse_union(const void *lyb_data, size_t lyb_data_len, uint32_t *type_idx, const void **lyb_value, size_t *lyb_value_len)
{
    uint64_t num = 0;

    assert(lyb_data && !(lyb_value && !lyb_value_len));

    if (type_idx) {
        memcpy(&num, lyb_data, TYPE_IDX_SIZE);
        num = le64toh(num);

        *type_idx = num;
    }

    if (lyb_value && lyb_value_len && lyb_data_len) {
        /* Get lyb_value and its length. */
        if (lyb_data_len == TYPE_IDX_SIZE) {
            *lyb_value_len = 0;
            *lyb_value = "";
        } else {
            *lyb_value_len = lyb_data_len - TYPE_IDX_SIZE;
            *lyb_value = (char *)lyb_data + TYPE_IDX_SIZE;
        }
    }
}